

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# materials.h
# Opt level: O0

BSDF * __thiscall
pbrt::DiffuseMaterial::GetBSDF<pbrt::UniversalTextureEvaluator>
          (void *param_1,Vector3f *param_2,undefined8 *param_3,void *param_4)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  TextureEvalContext ctx;
  TextureEvalContext ctx_00;
  SampledWavelengths lambda;
  undefined1 auVar3 [64];
  undefined1 auVar4 [64];
  Float val;
  undefined1 auVar6 [56];
  undefined1 auVar5 [64];
  undefined8 in_XMM1_Qb;
  SampledSpectrum SVar7;
  Float sig;
  SampledSpectrum r;
  undefined1 auVar8 [16];
  undefined1 auVar9 [32];
  undefined1 in_stack_fffffffffffffe08 [64];
  undefined8 uVar10;
  Float eta;
  BxDFHandle *bxdf;
  Vector3f *dpdus;
  Normal3f *in_stack_fffffffffffffe68;
  Normal3f *n;
  BSDF *this;
  UniversalTextureEvaluator *in_stack_fffffffffffffe90;
  undefined8 in_stack_fffffffffffffea0;
  undefined8 in_stack_fffffffffffffea8;
  BSDF *pBVar11;
  undefined1 in_stack_fffffffffffffeb8 [32];
  SpectrumTextureHandle *in_stack_fffffffffffffed8;
  UniversalTextureEvaluator *in_stack_fffffffffffffee0;
  undefined8 local_108;
  undefined1 auVar12 [12];
  undefined1 auVar13 [12];
  undefined1 auVar14 [12];
  undefined1 in_stack_ffffffffffffff00 [56];
  undefined8 in_stack_ffffffffffffff38;
  undefined4 in_stack_ffffffffffffff40;
  undefined4 in_stack_ffffffffffffff44;
  undefined1 local_50 [16];
  undefined8 local_40;
  undefined8 local_38;
  undefined8 local_30;
  void *local_28;
  undefined8 *local_20;
  Vector3f *local_18;
  void *local_8;
  
  this = (BSDF *)&stack0x00000008;
  n = (Normal3f *)local_50;
  pBVar11 = (BSDF *)param_1;
  local_28 = param_4;
  local_20 = param_3;
  local_18 = param_2;
  local_8 = param_1;
  SpectrumTextureHandle::SpectrumTextureHandle
            (in_stack_fffffffffffffe08._8_8_,in_stack_fffffffffffffe08._0_8_);
  auVar3 = vmovdqu64_avx512f((undefined1  [64])*this);
  auVar3 = vmovdqu64_avx512f(auVar3);
  uVar10 = local_20[1];
  bxdf = (BxDFHandle *)local_20[2];
  dpdus = (Vector3f *)local_20[3];
  auVar4 = vmovdqu64_avx512f(auVar3);
  auVar3 = vmovdqu64_avx512f(auVar4);
  auVar8 = auVar3._0_16_;
  auVar6 = ZEXT856(auVar4._8_8_);
  ctx_00.dvdy = (Float)(int)in_stack_ffffffffffffff38;
  ctx_00.faceIndex = (int)((ulong)in_stack_ffffffffffffff38 >> 0x20);
  auVar12 = in_stack_ffffffffffffff00._0_12_;
  auVar13 = in_stack_ffffffffffffff00._12_12_;
  auVar14 = in_stack_ffffffffffffff00._24_12_;
  ctx_00.p.super_Tuple3<pbrt::Point3,_float>.x = (float)auVar12._0_4_;
  ctx_00.p.super_Tuple3<pbrt::Point3,_float>.y = (float)auVar12._4_4_;
  ctx_00.p.super_Tuple3<pbrt::Point3,_float>.z = (float)auVar12._8_4_;
  ctx_00.dpdx.super_Tuple3<pbrt::Vector3,_float>.x = (float)auVar13._0_4_;
  ctx_00.dpdx.super_Tuple3<pbrt::Vector3,_float>.y = (float)auVar13._4_4_;
  ctx_00.dpdx.super_Tuple3<pbrt::Vector3,_float>.z = (float)auVar13._8_4_;
  ctx_00.dpdy.super_Tuple3<pbrt::Vector3,_float>.x = (float)auVar14._0_4_;
  ctx_00.dpdy.super_Tuple3<pbrt::Vector3,_float>.y = (float)auVar14._4_4_;
  ctx_00.dpdy.super_Tuple3<pbrt::Vector3,_float>.z = (float)auVar14._8_4_;
  ctx_00.uv.super_Tuple2<pbrt::Point2,_float>.x = (float)(int)in_stack_ffffffffffffff00._36_8_;
  ctx_00.uv.super_Tuple2<pbrt::Point2,_float>.y =
       (float)(int)((ulong)in_stack_ffffffffffffff00._36_8_ >> 0x20);
  ctx_00.dudx = (Float)in_stack_ffffffffffffff00._44_4_;
  ctx_00.dudy = (Float)in_stack_ffffffffffffff00._48_4_;
  ctx_00.dvdx = (Float)in_stack_ffffffffffffff00._52_4_;
  lambda.lambda.values[1] = (float)in_stack_ffffffffffffff44;
  lambda.lambda.values[0] = (float)in_stack_ffffffffffffff40;
  lambda.lambda.values._8_8_ = *local_20;
  lambda.pdf.values[0] = (float)(int)uVar10;
  lambda.pdf.values[1] = (float)(int)((ulong)uVar10 >> 0x20);
  lambda.pdf.values._8_8_ = bxdf;
  SVar7 = UniversalTextureEvaluator::operator()
                    (in_stack_fffffffffffffee0,in_stack_fffffffffffffed8,ctx_00,lambda);
  eta = (Float)((ulong)uVar10 >> 0x20);
  auVar4._0_8_ = SVar7.values.values._0_8_;
  auVar4._8_56_ = auVar6;
  local_50._8_8_ = vmovlpd_avx(auVar4._0_16_);
  auVar1._8_8_ = in_XMM1_Qb;
  auVar1._0_8_ = SVar7.values.values._8_8_;
  local_40 = vmovlpd_avx(auVar1);
  SVar7 = Clamp<int,int>(auVar8._8_8_,auVar8._4_4_,auVar8._0_4_);
  auVar5._0_8_ = SVar7.values.values._0_8_;
  auVar5._8_56_ = auVar6;
  local_38 = vmovlpd_avx(auVar5._0_16_);
  auVar2._8_8_ = in_XMM1_Qb;
  auVar2._0_8_ = SVar7.values.values._8_8_;
  local_30 = vmovlpd_avx(auVar2);
  FloatTextureHandle::FloatTextureHandle(auVar8._8_8_,auVar8._0_8_);
  memcpy(&local_108,this,0x40);
  auVar3._8_56_ = in_stack_ffffffffffffff00;
  auVar3._0_8_ = local_108;
  auVar3 = vmovdqu64_avx512f(auVar3);
  auVar3 = vmovdqu64_avx512f(auVar3);
  auVar9 = auVar3._0_32_;
  ctx.p.super_Tuple3<pbrt::Point3,_float>.z = (float)(int)in_stack_fffffffffffffea8;
  ctx.dpdx.super_Tuple3<pbrt::Vector3,_float>.x =
       (float)(int)((ulong)in_stack_fffffffffffffea8 >> 0x20);
  ctx.p.super_Tuple3<pbrt::Point3,_float>.x = (float)(int)in_stack_fffffffffffffea0;
  ctx.p.super_Tuple3<pbrt::Point3,_float>.y = (float)(int)((ulong)in_stack_fffffffffffffea0 >> 0x20)
  ;
  ctx.dpdx.super_Tuple3<pbrt::Vector3,_float>._4_8_ = pBVar11;
  auVar12 = in_stack_fffffffffffffeb8._0_12_;
  ctx.dpdy.super_Tuple3<pbrt::Vector3,_float>.x = (float)auVar12._0_4_;
  ctx.dpdy.super_Tuple3<pbrt::Vector3,_float>.y = (float)auVar12._4_4_;
  ctx.dpdy.super_Tuple3<pbrt::Vector3,_float>.z = (float)auVar12._8_4_;
  ctx.uv.super_Tuple2<pbrt::Point2,_float>.x = (float)(int)in_stack_fffffffffffffeb8._12_8_;
  ctx.uv.super_Tuple2<pbrt::Point2,_float>.y =
       (float)(int)((ulong)in_stack_fffffffffffffeb8._12_8_ >> 0x20);
  ctx.dudx = (Float)in_stack_fffffffffffffeb8._20_4_;
  ctx.dudy = (Float)in_stack_fffffffffffffeb8._24_4_;
  ctx.dvdx = (Float)in_stack_fffffffffffffeb8._28_4_;
  ctx._56_8_ = in_stack_fffffffffffffed8;
  val = UniversalTextureEvaluator::operator()
                  (in_stack_fffffffffffffe90,(FloatTextureHandle *)param_1,ctx);
  Clamp<float,int,int>(val,0,0x5a);
  SampledSpectrum::SampledSpectrum(auVar9._8_8_,auVar9._4_4_);
  auVar8 = auVar9._0_16_;
  DiffuseBxDF::DiffuseBxDF(auVar9._24_8_,auVar9._16_8_,auVar9._8_8_,auVar9._4_4_);
  memcpy(local_28,&stack0xfffffffffffffed0,0x28);
  BxDFHandle::TaggedPointer<pbrt::DiffuseBxDF>(auVar8._8_8_,auVar8._0_8_);
  BSDF::BSDF(this,param_2,n,in_stack_fffffffffffffe68,dpdus,bxdf,eta);
  return pBVar11;
}

Assistant:

PBRT_CPU_GPU BSDF GetBSDF(TextureEvaluator texEval, MaterialEvalContext ctx,
                              SampledWavelengths &lambda, DiffuseBxDF *bxdf) const {
        // Evaluate textures for _DiffuseMaterial_ and allocate BSDF
        SampledSpectrum r = Clamp(texEval(reflectance, ctx, lambda), 0, 1);
        Float sig = Clamp(texEval(sigma, ctx), 0, 90);
        *bxdf = DiffuseBxDF(r, SampledSpectrum(0), sig);
        return BSDF(ctx.wo, ctx.n, ctx.ns, ctx.dpdus, bxdf);
    }